

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

BOOL __thiscall GlobOpt::PRE::PreloadPRECandidate(PRE *this,Loop *loop,GlobHashBucket *candidate)

{
  code *pcVar1;
  GlobOptBlockData *this_00;
  PRE *pPVar2;
  Loop *pLVar3;
  BOOLEAN BVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  PropertySym *pPVar8;
  undefined4 *puVar9;
  Value *pVVar10;
  Instr **ppIVar11;
  Instr *pIVar12;
  StackSym *pSVar13;
  RegOpnd *newDst;
  PropertySym *propertySym_00;
  ProfiledInstr *pPVar14;
  BasicBlock *pBVar15;
  char16_t *reason;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar16;
  BasicBlock *pBVar17;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  PropertySym *local_98;
  PropertySym *propertySym;
  GlobOptBlockData *local_88;
  StackSym *local_80;
  Instr *local_78;
  Value *initialValue;
  Value *local_68;
  Value *local_60;
  Instr *local_58;
  PropertySym *local_50;
  PRE *local_48;
  Loop *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  pPVar8 = Sym::AsPropertySym(candidate->value);
  local_98 = pPVar8;
  BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->candidates->candidatesToProcess,(pPVar8->super_Sym).m_id);
  if (BVar4 == '\0') {
    return 0;
  }
  local_60 = candidate->element;
  pSVar13 = pPVar8->m_stackSym;
  local_80 = (StackSym *)0x0;
  local_50 = pPVar8;
  bVar5 = GlobOptBlockData::IsLive(&loop->landingPad->globOptData,&pSVar13->super_Sym);
  local_40 = loop;
  if (!bVar5) {
    uVar6 = Func::GetSourceContextId(this->globOpt->func);
    uVar7 = Func::GetLocalFunctionId(this->globOpt->func);
    bVar5 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,MakeObjSymLiveInLandingPadPhase,uVar6,uVar7);
    loop = local_40;
    if (bVar5) {
      return 0;
    }
    if (((pSVar13->field_0x18 & 1) == 0) || ((pSVar13->field_5).m_instrDef == (Instr *)0x0)) {
      reason = L"Object sym not live in landing pad and not single-def";
LAB_0041f3c0:
      TraceFailedPreloadInLandingPad(this,loop,local_50,reason);
      return 0;
    }
    bVar5 = InsertSymDefinitionInLandingPad(this,pSVar13,local_40,(Sym **)&local_80);
    if (!bVar5) {
      reason = L"Failed to insert load of object sym in landing pad";
      goto LAB_0041f3c0;
    }
  }
  initialValue = (Value *)pSVar13;
  bVar5 = GlobOptBlockData::IsLive(&loop->landingPad->globOptData,&pSVar13->super_Sym);
  local_48 = this;
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3f5,"(loop->landingPad->globOptData.IsLive(objPtrSym))",
                       "loop->landingPad->globOptData.IsLive(objPtrSym)");
    if (!bVar5) goto LAB_0041f592;
    *puVar9 = 0;
  }
  pBVar15 = loop->landingPad;
  pPVar8 = (PropertySym *)local_60->valueInfo->symStore;
  if ((pPVar8 == (PropertySym *)0x0) ||
     (pBVar17 = pBVar15, (pPVar8->super_Sym).m_kind != SymKindStack)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3fc,"(symStore && symStore->IsStackSym())",
                       "symStore && symStore->IsStackSym()");
    if (!bVar5) goto LAB_0041f592;
    *puVar9 = 0;
    pBVar17 = loop->landingPad;
  }
  propertySym = pPVar8;
  bVar5 = GlobOptBlockData::IsLive(&pBVar17->globOptData,(Sym *)pPVar8);
  pPVar8 = local_50;
  if (bVar5) {
    return 0;
  }
  local_88 = &pBVar15->globOptData;
  pVVar10 = GlobOptBlockData::FindValue(local_88,&local_50->super_Sym);
  if (pVVar10 == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x408,"(landingPadValue)","landingPadValue");
    if (!bVar5) goto LAB_0041f592;
    *puVar9 = 0;
    pPVar8 = local_50;
  }
  local_78 = (Instr *)0x0;
  ppIVar11 = JsUtil::
             BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::LookupWithKey<unsigned_int>
                       (local_48->globOpt->prePassInstrMap,&(pPVar8->super_Sym).m_id,&local_78);
  pIVar12 = *ppIVar11;
  if (pIVar12 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x40b,"(ldInstrInLoop)","ldInstrInLoop");
    if (!bVar5) goto LAB_0041f592;
    *puVar9 = 0;
  }
  if (pIVar12->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x40c,"(ldInstrInLoop->GetDst() == nullptr)",
                       "ldInstrInLoop->GetDst() == nullptr");
    if (!bVar5) goto LAB_0041f592;
    *puVar9 = 0;
    loop = local_40;
  }
  bVar5 = IsPREInstrCandidateLoad(pIVar12->m_opcode);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x40f,"(IsPREInstrCandidateLoad(ldInstrInLoop->m_opcode))",
                       "IsPREInstrCandidateLoad(ldInstrInLoop->m_opcode)");
    if (!bVar5) goto LAB_0041f592;
    *puVar9 = 0;
    loop = local_40;
  }
  pIVar12 = InsertPropertySymPreloadInLandingPad(local_48,pIVar12,loop,local_50);
  pPVar8 = propertySym;
  if (pIVar12 == (Instr *)0x0) {
    return 0;
  }
  local_68 = pVVar10;
  if (pIVar12->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x417,"(ldInstr->GetDst() == nullptr)","ldInstr->GetDst() == nullptr");
    if (!bVar5) {
LAB_0041f592:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar9 = 0;
    loop = local_40;
  }
  pSVar13 = Sym::AsStackSym(&pPVar8->super_Sym);
  newDst = IR::RegOpnd::New(pSVar13,TyVar,local_48->globOpt->func);
  local_58 = pIVar12;
  IR::Instr::SetDst(pIVar12,&newDst->super_Opnd);
  BVSparse<Memory::JitArenaAllocator>::Set(loop->fieldPRESymStores,(pPVar8->super_Sym).m_id);
  BVSparse<Memory::JitArenaAllocator>::Set
            ((pBVar15->globOptData).liveVarSyms,(pPVar8->super_Sym).m_id);
  this_00 = local_88;
  pVVar10 = GlobOptBlockData::FindValue(local_88,(Sym *)initialValue);
  pSVar13 = local_80;
  if ((local_80 != (StackSym *)0x0) ||
     ((pVVar10 != (Value *)0x0 &&
      (pSVar13 = GlobOptBlockData::GetCopyPropSym(this_00,(Sym *)initialValue,pVVar10),
      pSVar13 != (StackSym *)0x0)))) {
    propertySym_00 =
         PropertySym::FindOrCreate
                   ((pSVar13->super_Sym).m_id,local_50->m_propertyId,local_50->m_propertyIdIndex,
                    local_50->m_inlineCacheIndex,(local_50->super_Sym).field_0x15,
                    local_48->globOpt->func);
    pVVar10 = GlobOptBlockData::FindValue(this_00,&propertySym_00->super_Sym);
    if (pVVar10 == (Value *)0x0) {
      GlobOptBlockData::SetValue(this_00,local_68,&propertySym_00->super_Sym);
      this_01 = (pBVar15->globOptData).liveFields;
      BVSparse<Memory::JitArenaAllocator>::Set(this_01,(propertySym_00->super_Sym).m_id);
      MakePropertySymLiveOnBackEdges((PRE *)this_01,propertySym_00,loop,local_60);
    }
  }
  local_32[0].field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
  local_78 = (Instr *)0x0;
  bVar5 = JsUtil::
          BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<PropertySym*>
                    ((BaseDictionary<PropertySym*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&loop->initialValueFieldMap,&local_98,(Value **)&local_78);
  pVVar10 = local_60;
  pIVar12 = local_58;
  if (bVar5) {
    if (local_58->m_kind == InstrKindProfiled) {
      if (*(ValueNumber *)&local_78->_vptr_Instr == local_60->valueNumber) {
        bVar5 = ValueType::IsUninitialized(&local_60->valueInfo->super_ValueType);
        pIVar12 = local_58;
        if (bVar5) {
          pPVar14 = IR::Instr::AsProfiledInstr(local_58);
          aVar16 = (anon_union_2_4_ea848c7b_for_ValueType_13)(pPVar14->u).field_3.fldInfoData.f1;
        }
        else {
          aVar16 = (pVVar10->valueInfo->super_ValueType).field_0;
        }
      }
      else {
        aVar16.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
      }
      local_32[0] = aVar16;
      pPVar14 = IR::Instr::AsProfiledInstr(pIVar12);
      (pPVar14->u).field_3.fldInfoData.f1 = (TSize)aVar16;
    }
  }
  else {
    local_32[0] = (local_68->valueInfo->super_ValueType).field_0;
  }
  pLVar3 = local_40;
  BVSparse<Memory::JitArenaAllocator>::Set(local_40->symsUsedBeforeDefined,(pPVar8->super_Sym).m_id)
  ;
  bVar5 = ValueType::IsLikelyNumber((ValueType *)&local_32[0].field_0);
  if (bVar5) {
    BVSparse<Memory::JitArenaAllocator>::Set
              (pLVar3->likelyNumberSymsUsedBeforeDefined,(pPVar8->super_Sym).m_id);
    if ((local_48->globOpt->field_0xf5 & 2) == 0) {
      bVar5 = ValueType::IsInt((ValueType *)&local_32[0].field_0);
    }
    else {
      bVar5 = ValueType::IsLikelyInt((ValueType *)&local_32[0].field_0);
    }
    if (bVar5 != false) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (pLVar3->likelyIntSymsUsedBeforeDefined,(pPVar8->super_Sym).m_id);
    }
  }
  pPVar2 = local_48;
  uVar6 = Func::GetSourceContextId(local_48->globOpt->func);
  uVar7 = Func::GetLocalFunctionId(pPVar2->globOpt->func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,FieldPREPhase,uVar6,uVar7);
  if (bVar5) {
    pBVar15 = Loop::GetHeadBlock(local_40);
    Output::Print(L"** TRACE: Field PRE: field pre-loaded in landing pad of loop head #%-3d: ",
                  (ulong)pBVar15->number);
    IR::Instr::Dump(pIVar12);
    Output::Print(L"\n");
    Output::Flush();
  }
  return 1;
}

Assistant:

BOOL GlobOpt::PRE::PreloadPRECandidate(Loop *loop, GlobHashBucket* candidate)
{
    // Insert a load for each field PRE candidate.
    PropertySym *propertySym = candidate->value->AsPropertySym();
    if (!candidates->candidatesToProcess->TestAndClear(propertySym->m_id))
    {
        return false;
    }
    Value * propSymValueOnBackEdge = candidate->element;

    StackSym *objPtrSym = propertySym->m_stackSym;
    Sym * objPtrCopyPropSym = nullptr;

    if (!loop->landingPad->globOptData.IsLive(objPtrSym))
    {
        if (PHASE_OFF(Js::MakeObjSymLiveInLandingPadPhase, this->globOpt->func))
        {
            return false;
        }
        if (objPtrSym->IsSingleDef())
        {
            // We can still try to do PRE if the object sym is single def, even if its not live in the landing pad.
            // We'll have to add a def instruction for the object sym in the landing pad, and then we can continue
            // pre-loading the current PRE candidate.
            // Case in point:
            // $L1            
            //                value|symStore
            //      t1 = o.x    (v1|t3)
            //      t2 = t1.y   (v2|t4) <-- t1 is not live in the loop landing pad
            //      jmp $L1

            if (!InsertSymDefinitionInLandingPad(objPtrSym, loop, &objPtrCopyPropSym))
            {
#if DBG_DUMP
                TraceFailedPreloadInLandingPad(loop, propertySym, _u("Failed to insert load of object sym in landing pad"));
#endif
                return false;
            }
        }
        else
        {
#if DBG_DUMP
            TraceFailedPreloadInLandingPad(loop, propertySym, _u("Object sym not live in landing pad and not single-def"));
#endif
            return false;
        }
    }
    Assert(loop->landingPad->globOptData.IsLive(objPtrSym));

    BasicBlock *landingPad = loop->landingPad;
    Sym *symStore = propSymValueOnBackEdge->GetValueInfo()->GetSymStore();

    // The symStore can't be live into the loop
    // The symStore needs to still have the same value
    Assert(symStore && symStore->IsStackSym());

    if (loop->landingPad->globOptData.IsLive(symStore))
    {
        // May have already been hoisted:
        //  o.x = t1;
        //  o.y = t1;
        return false;
    }
    Value *landingPadValue = landingPad->globOptData.FindValue(propertySym);

    // Value should be added as initial value or already be there.
    Assert(landingPadValue);

    IR::Instr * ldInstrInLoop = this->globOpt->prePassInstrMap->Lookup(propertySym->m_id, nullptr);
    Assert(ldInstrInLoop);
    Assert(ldInstrInLoop->GetDst() == nullptr);

    // Create instr to put in landing pad for compensation
    Assert(IsPREInstrCandidateLoad(ldInstrInLoop->m_opcode));

    IR::Instr * ldInstr = InsertPropertySymPreloadInLandingPad(ldInstrInLoop, loop, propertySym);
    if (!ldInstr)
    {
        return false;
    }

    Assert(ldInstr->GetDst() == nullptr);
    ldInstr->SetDst(IR::RegOpnd::New(symStore->AsStackSym(), TyVar, this->globOpt->func));
    loop->fieldPRESymStores->Set(symStore->m_id);
    landingPad->globOptData.liveVarSyms->Set(symStore->m_id);

    Value * objPtrValue = landingPad->globOptData.FindValue(objPtrSym);

    objPtrCopyPropSym = objPtrCopyPropSym ? objPtrCopyPropSym : objPtrValue ? landingPad->globOptData.GetCopyPropSym(objPtrSym, objPtrValue) : nullptr;
    if (objPtrCopyPropSym)
    {
        // If we inserted T4 = T1.y, and T3 is the copy prop sym for T1 in the landing pad, we need T3.y 
        // to be live on back edges to have the merge produce a value for T3.y. Having a value for T1.y 
        // produced from the merge is not enough as the T1.y in the loop will get obj-ptr-copy-propped to 
        // T3.y

        // T3.y
        PropertySym *newPropSym = PropertySym::FindOrCreate(
            objPtrCopyPropSym->m_id, propertySym->m_propertyId, propertySym->GetPropertyIdIndex(), propertySym->GetInlineCacheIndex(), propertySym->m_fieldKind, this->globOpt->func);

        if (!landingPad->globOptData.FindValue(newPropSym))
        {
            landingPad->globOptData.SetValue(landingPadValue, newPropSym);
            landingPad->globOptData.liveFields->Set(newPropSym->m_id);
            MakePropertySymLiveOnBackEdges(newPropSym, loop, propSymValueOnBackEdge);
        }
    }

    ValueType valueType(ValueType::Uninitialized);
    Value *initialValue = nullptr;

    if (loop->initialValueFieldMap.TryGetValue(propertySym, &initialValue))
    {
        if (ldInstr->IsProfiledInstr())
        {
            if (initialValue->GetValueNumber() == propSymValueOnBackEdge->GetValueNumber())
            {
                if (propSymValueOnBackEdge->GetValueInfo()->IsUninitialized())
                {
                    valueType = ldInstr->AsProfiledInstr()->u.FldInfo().valueType;
                }
                else
                {
                    valueType = propSymValueOnBackEdge->GetValueInfo()->Type();
                }
            }
            else
            {
                valueType = ValueType::Uninitialized;
            }
            ldInstr->AsProfiledInstr()->u.FldInfo().valueType = valueType;
        }
    }
    else
    {
        valueType = landingPadValue->GetValueInfo()->Type();
    }

    loop->symsUsedBeforeDefined->Set(symStore->m_id);

    if (valueType.IsLikelyNumber())
    {
        loop->likelyNumberSymsUsedBeforeDefined->Set(symStore->m_id);
        if (globOpt->DoAggressiveIntTypeSpec() ? valueType.IsLikelyInt() : valueType.IsInt())
        {
            // Can only force int conversions in the landing pad based on likely-int values if aggressive int type
            // specialization is enabled
            loop->likelyIntSymsUsedBeforeDefined->Set(symStore->m_id);
        }
    }

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldPREPhase, this->globOpt->func->GetSourceContextId(), this->globOpt->func->GetLocalFunctionId()))
    {
        Output::Print(_u("** TRACE: Field PRE: field pre-loaded in landing pad of loop head #%-3d: "), loop->GetHeadBlock()->GetBlockNum());
        ldInstr->Dump();
        Output::Print(_u("\n"));
        Output::Flush();
    }
#endif

    return true;
}